

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O2

void __thiscall
embree::ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
::tbbRadixIteration1
          (ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
           *this,uint shift,KeyValue *src,KeyValue *dst,size_t threadIndex,size_t threadCount)

{
  uint *puVar1;
  size_t sVar2;
  KeyValue KVar3;
  uint uVar4;
  uint uVar5;
  TyRadixCount *pauVar6;
  ulong uVar7;
  TyRadixCount *pauVar8;
  long lVar9;
  size_t i_4;
  uint uVar10;
  ulong uVar11;
  size_t i_1;
  size_t sVar12;
  uint offset [256];
  uint total [256];
  uint local_880 [256];
  uint local_480 [282];
  
  sVar2 = this->N;
  for (uVar7 = 0; uVar7 < 0x100; uVar7 = uVar7 + 4) {
    *(undefined1 (*) [16])(local_480 + uVar7) = (undefined1  [16])0x0;
  }
  uVar7 = (sVar2 * threadIndex) / threadCount;
  pauVar6 = this->radixCount;
  pauVar8 = pauVar6;
  for (sVar12 = 0; sVar12 != threadCount; sVar12 = sVar12 + 1) {
    for (uVar11 = 0; uVar11 < 0x100; uVar11 = uVar11 + 4) {
      puVar1 = *pauVar8 + uVar11;
      uVar10 = puVar1[1];
      uVar4 = puVar1[2];
      uVar5 = puVar1[3];
      local_480[uVar11] = *puVar1 + local_480[uVar11];
      local_480[uVar11 + 1] = uVar10 + local_480[uVar11 + 1];
      local_480[uVar11 + 2] = uVar4 + local_480[uVar11 + 2];
      local_480[uVar11 + 3] = uVar5 + local_480[uVar11 + 3];
    }
    pauVar8 = pauVar8 + 1;
  }
  local_880[0] = 0;
  uVar10 = 0;
  for (lVar9 = 1; lVar9 != 0x100; lVar9 = lVar9 + 1) {
    uVar10 = uVar10 + local_880[lVar9 + 0xff];
    local_880[lVar9] = uVar10;
  }
  for (sVar12 = 0; sVar12 != threadIndex; sVar12 = sVar12 + 1) {
    for (uVar11 = 0; uVar11 < 0x100; uVar11 = uVar11 + 4) {
      puVar1 = *pauVar6 + uVar11;
      uVar10 = puVar1[1];
      uVar4 = puVar1[2];
      uVar5 = puVar1[3];
      local_880[uVar11] = *puVar1 + local_880[uVar11];
      local_880[uVar11 + 1] = uVar10 + local_880[uVar11 + 1];
      local_880[uVar11 + 2] = uVar4 + local_880[uVar11 + 2];
      local_880[uVar11 + 3] = uVar5 + local_880[uVar11 + 3];
    }
    pauVar6 = pauVar6 + 1;
  }
  for (; uVar7 < ((threadIndex + 1) * sVar2) / threadCount; uVar7 = uVar7 + 1) {
    KVar3 = src[uVar7];
    uVar11 = ((ulong)KVar3 & 0xffffffff) >> ((byte)shift & 0x3f) & 0xff;
    uVar10 = local_880[uVar11];
    local_880[uVar11] = uVar10 + 1;
    dst[uVar10] = KVar3;
  }
  return;
}

Assistant:

void tbbRadixIteration1(const Key shift, 
                            const Ty* __restrict const src, 
                            Ty* __restrict const dst, 
                            const size_t threadIndex, const size_t threadCount)
    {
      const size_t startID = (threadIndex+0)*N/threadCount;
      const size_t endID   = (threadIndex+1)*N/threadCount;
      
      /* mask to extract some number of bits */
      const Key mask = BUCKETS-1;
      
      /* calculate total number of items for each bucket */
      __aligned(64) unsigned int total[BUCKETS];
      /*
      for (size_t i=0; i<BUCKETS; i++)
        total[i] = 0;
      */
      for (size_t i=0; i<BUCKETS; i+=VSIZEX)
        vintx::store(&total[i], zero);
      
      for (size_t i=0; i<threadCount; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          total[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&total[j], vintx::load(&total[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* calculate start offset of each bucket */
      __aligned(64) unsigned int offset[BUCKETS];
      offset[0] = 0;
      for (size_t i=1; i<BUCKETS; i++)    
        offset[i] = offset[i-1] + total[i-1];
      
      /* calculate start offset of each bucket for this thread */
      for (size_t i=0; i<threadIndex; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          offset[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&offset[j], vintx::load(&offset[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* copy items into their buckets */
#if defined(__INTEL_COMPILER)
#pragma nounroll
#endif
      for (size_t i=startID; i<endID; i++) {
        const Ty elt = src[i];
#if defined(__64BIT__)
        const size_t index = ((size_t)(Key)src[i] >> (size_t)shift) & (size_t)mask;
#else
        const size_t index = ((Key)src[i] >> shift) & mask;
#endif
        dst[offset[index]++] = elt;
      }
    }